

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O3

void __thiscall GmmLib::GmmXe2_LPGCachePolicy::SetUpMOCSTable(GmmXe2_LPGCachePolicy *this)

{
  uint uVar1;
  Context *pCVar2;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar3;
  GmmGen12CachePolicy *pGVar4;
  long lVar5;
  undefined1 in_XMM0 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pCVar2 = *(Context **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8);
  lVar5 = 0;
  auVar6 = pmovsxbw(in_XMM0,0x303030303030303);
  auVar7 = pmovsxbw(in_XMM1,0x3c3c3c3c3c3c3c3c);
  do {
    pGVar3 = pCVar2->CachePolicyTbl + lVar5;
    uVar1._0_2_ = pGVar3->L3;
    uVar1._2_1_ = pGVar3->HDCL1;
    uVar1._3_1_ = pGVar3->field_0x7;
    auVar8._10_2_ = pCVar2->CachePolicyTbl[lVar5 + 5].L3.UshortValue;
    auVar8._8_2_ = pCVar2->CachePolicyTbl[lVar5 + 4].L3.UshortValue;
    auVar8._12_2_ = pCVar2->CachePolicyTbl[lVar5 + 6].L3.UshortValue;
    auVar8._14_2_ = pCVar2->CachePolicyTbl[lVar5 + 7].L3.UshortValue;
    auVar8._0_8_ = (ulong)uVar1 & 0xffffffff0000ffff |
                   (ulong)pCVar2->CachePolicyTbl[lVar5 + 1].L3.UshortValue << 0x10 |
                   (ulong)pCVar2->CachePolicyTbl[lVar5 + 2].L3.UshortValue << 0x20 |
                   (ulong)pCVar2->CachePolicyTbl[lVar5 + 3].L3.UshortValue << 0x30;
    auVar8 = auVar8 & auVar6 | auVar7;
    pCVar2->CachePolicyTbl[lVar5].L3.UshortValue = auVar8._0_2_;
    pCVar2->CachePolicyTbl[lVar5 + 1].L3.UshortValue = auVar8._2_2_;
    pCVar2->CachePolicyTbl[lVar5 + 2].L3.UshortValue = auVar8._4_2_;
    pCVar2->CachePolicyTbl[lVar5 + 3].L3.UshortValue = auVar8._6_2_;
    pCVar2->CachePolicyTbl[lVar5 + 4].L3.UshortValue = auVar8._8_2_;
    pCVar2->CachePolicyTbl[lVar5 + 5].L3.UshortValue = auVar8._10_2_;
    pCVar2->CachePolicyTbl[lVar5 + 6].L3.UshortValue = auVar8._12_2_;
    pCVar2->CachePolicyTbl[lVar5 + 7].L3.UshortValue = auVar8._14_2_;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  pCVar2->CachePolicyTbl[0].L3.UshortValue = pCVar2->CachePolicyTbl[0].L3.UshortValue & 3 | 0xc;
  pCVar2->CachePolicyTbl[1].L3.UshortValue = pCVar2->CachePolicyTbl[1].L3.UshortValue & 3 | 0x10c;
  pCVar2->CachePolicyTbl[2].L3.UshortValue = pCVar2->CachePolicyTbl[2].L3.UshortValue & 3 | 0x130;
  pCVar2->CachePolicyTbl[3].L3.UshortValue = pCVar2->CachePolicyTbl[3].L3.UshortValue & 3 | 0x13c;
  pCVar2->CachePolicyTbl[4].L3.UshortValue = pCVar2->CachePolicyTbl[4].L3.UshortValue & 3 | 0x100;
  pGVar4 = &(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy;
  (pGVar4->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
  CurrentMaxMocsIndex = 4;
  (pGVar4->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
  CurrentMaxL1HdcMocsIndex = 0;
  (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
  CurrentMaxSpecialMocsIndex = 0;
  return;
}

Assistant:

void GmmLib::GmmXe2_LPGCachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define L3_WB (0x0)
#define L3_XD (pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush ? 0x1 : 0x0)
#define L3_UC (0x3)

#define GMM_DEFINE_MOCS(indx, L4Caching, L3Caching, L3ClassOfService, ignorePAT) \
    {                                                                            \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L4CC      = L4Caching;        \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.Reserved0 = 0;                \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L3CC      = L3Caching;        \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L3CLOS    = L3ClassOfService; \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.igPAT     = ignorePAT;        \
    }

    // clang-format off
    // Default MOCS Table
    for(uint32_t j = 0; j < GMM_XE2_NUM_MOCS_ENTRIES; j++)
    {   //               Index            CachingPolicy   L3Caching      L3ClassOfService    ignorePAT
        GMM_DEFINE_MOCS( j,               L4_UC,          L3_UC,             0          ,     0  )
    }

    //             Index    L4 CachingPolicy   L3 CachingPolicy   L3 CLOS   ignorePAT
    GMM_DEFINE_MOCS( 0      , L4_UC              , L3_WB           , 0     , 0)   // Defer to PAT
    GMM_DEFINE_MOCS( 1      , L4_UC              , L3_WB           , 0     , 1)   // L3
    GMM_DEFINE_MOCS( 2      , L4_WB              , L3_UC           , 0     , 1)   // L4
    GMM_DEFINE_MOCS( 3      , L4_UC              , L3_UC           , 0     , 1)   // UC
    GMM_DEFINE_MOCS( 4      , L4_WB              , L3_WB           , 0     , 1)   // L3+L4

    CurrentMaxMocsIndex = 4;
    CurrentMaxL1HdcMocsIndex   = 0;
    CurrentMaxSpecialMocsIndex = 0;
    // clang-format on

#undef GMM_DEFINE_MOCS
#undef L4_WB
#undef L4_WT
#undef L4_UC

#undef L3_WB
#undef L3_XD
#undef L3_UC
}